

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_1::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  Colour colour;
  Colour *in_stack_ffffffffffffffe0;
  
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x328f8b);
  if (bVar1) {
    std::operator<<((ostream *)*in_RDI,';');
    anon_unknown.dwarf_92731::dimColour();
    Colour::Colour(in_stack_ffffffffffffffe0,(Code)((ulong)in_RDI >> 0x20));
    std::operator<<((ostream *)*in_RDI," expression was:");
    Colour::~Colour((Colour *)0x328fd2);
    printOriginalExpression(this);
  }
  return;
}

Assistant:

void printExpressionWas() {
        if (result.hasExpression()) {
            stream << ';';
            {
                Colour colour(dimColour());
                stream << " expression was:";
            }
            printOriginalExpression();
        }
    }